

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       format_decimal<unsigned_long,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,unsigned_long value,int num_digits,
                 add_thousands_sep<char> thousands_sep)

{
  int in_EDX;
  long lVar1;
  char **in_RSI;
  long in_RDI;
  uint index;
  uint index_1;
  char *end;
  add_thousands_sep<char> *this;
  add_thousands_sep<char> *paVar2;
  
  this = (add_thousands_sep<char> *)(in_RDI + in_EDX);
  while ((char **)0x63 < in_RSI) {
    lVar1 = ((ulong)in_RSI % 100) * 2;
    in_RSI = (char **)((ulong)in_RSI / 100);
    paVar2 = (add_thousands_sep<char> *)((long)(this + 0xffffffffffffffff) + 0x17);
    *(undefined1 *)((long)(this + 0xffffffffffffffff) + 0x17) =
         basic_data<void>::DIGITS[(int)lVar1 + 1];
    add_thousands_sep<char>::operator()(paVar2,in_RSI);
    this = (add_thousands_sep<char> *)((long)(paVar2 + 0xffffffffffffffff) + 0x17);
    *(undefined1 *)((long)(paVar2 + 0xffffffffffffffff) + 0x17) = basic_data<void>::DIGITS[lVar1];
    add_thousands_sep<char>::operator()(this,in_RSI);
  }
  if (in_RSI < (char **)0xa) {
    *(char *)((long)(this + 0xffffffffffffffff) + 0x17) = (char)in_RSI + '0';
  }
  else {
    paVar2 = (add_thousands_sep<char> *)((long)(this + 0xffffffffffffffff) + 0x17);
    *(undefined1 *)((long)(this + 0xffffffffffffffff) + 0x17) =
         basic_data<void>::DIGITS[(int)((long)in_RSI << 1) + 1];
    add_thousands_sep<char>::operator()(paVar2,in_RSI);
    *(undefined1 *)((long)(paVar2 + 0xffffffffffffffff) + 0x17) =
         basic_data<void>::DIGITS[(long)in_RSI << 1 & 0xffffffff];
  }
  return (char *)(add_thousands_sep<char> *)(in_RDI + in_EDX);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}